

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_a<ncnn::BinaryOp_x86_avx512_functor::binary_op_rdiv>
               (float *ptr,float *ptr1,float *outptr,int size,int elempack)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  int in_ECX;
  float *in_RDX;
  undefined1 (*in_RSI) [64];
  undefined1 (*in_RDI) [64];
  int in_R8D;
  undefined1 auVar5 [64];
  __m128 _outp_2;
  __m128 _b_2;
  __m256 _outp_1;
  __m256 _b_1;
  __m512 _outp;
  __m512 _b;
  __m512 _a_512;
  __m256 _a_256;
  __m128 _a_128;
  int i;
  float a;
  binary_op_rdiv op;
  undefined1 local_540 [64];
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 uStack_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  int local_33c;
  float *local_328;
  undefined1 (*local_320) [64];
  
  fVar1 = *(float *)*in_RDI;
  local_33c = 0;
  if (in_R8D == 4) {
    local_4b0 = *(undefined8 *)*in_RDI;
    uStack_4a8 = *(undefined8 *)(*in_RDI + 8);
  }
  else {
    local_4b0 = CONCAT44(fVar1,fVar1);
    uStack_4a8 = CONCAT44(fVar1,fVar1);
  }
  if (in_R8D == 8) {
    local_4e0 = *(undefined8 *)*in_RDI;
    uStack_4d8 = *(undefined8 *)(*in_RDI + 8);
    uStack_4d0 = *(undefined8 *)(*in_RDI + 0x10);
    uStack_4c8 = *(undefined8 *)(*in_RDI + 0x18);
  }
  else {
    local_4e0 = local_4b0;
    uStack_4d8 = uStack_4a8;
    uStack_4d0 = local_4b0;
    uStack_4c8 = uStack_4a8;
  }
  local_328 = in_RDX;
  local_320 = in_RSI;
  if (in_R8D == 0x10) {
    local_540 = *in_RDI;
  }
  else {
    auVar3._8_8_ = uStack_4d8;
    auVar3._0_8_ = local_4e0;
    auVar3._16_8_ = uStack_4d0;
    auVar3._24_8_ = uStack_4c8;
    local_540 = vinsertf64x4_avx512f
                          (ZEXT3264(CONCAT824(uStack_4c8,
                                              CONCAT816(uStack_4d0,CONCAT88(uStack_4d8,local_4e0))))
                           ,auVar3,1);
  }
  for (; local_33c + 0xf < in_ECX; local_33c = local_33c + 0x10) {
    auVar5 = vdivps_avx512f(*local_320,local_540);
    local_440 = auVar5._0_8_;
    uStack_438 = auVar5._8_8_;
    uStack_430 = auVar5._16_8_;
    uStack_428 = auVar5._24_8_;
    uStack_420 = auVar5._32_8_;
    uStack_418 = auVar5._40_8_;
    uStack_410 = auVar5._48_8_;
    uStack_408 = auVar5._56_8_;
    *(undefined8 *)local_328 = local_440;
    *(undefined8 *)(local_328 + 2) = uStack_438;
    *(undefined8 *)(local_328 + 4) = uStack_430;
    *(undefined8 *)(local_328 + 6) = uStack_428;
    *(undefined8 *)(local_328 + 8) = uStack_420;
    *(undefined8 *)(local_328 + 10) = uStack_418;
    *(undefined8 *)(local_328 + 0xc) = uStack_410;
    *(undefined8 *)(local_328 + 0xe) = uStack_408;
    local_320 = local_320 + 1;
    local_328 = local_328 + 0x10;
  }
  for (; local_33c + 7 < in_ECX; local_33c = local_33c + 8) {
    auVar4._8_8_ = uStack_4d8;
    auVar4._0_8_ = local_4e0;
    auVar4._16_8_ = uStack_4d0;
    auVar4._24_8_ = uStack_4c8;
    auVar3 = vdivps_avx(*(undefined1 (*) [32])*local_320,auVar4);
    local_480 = auVar3._0_8_;
    uStack_478 = auVar3._8_8_;
    uStack_470 = auVar3._16_8_;
    uStack_468 = auVar3._24_8_;
    *(undefined8 *)local_328 = local_480;
    *(undefined8 *)(local_328 + 2) = uStack_478;
    *(undefined8 *)(local_328 + 4) = uStack_470;
    *(undefined8 *)(local_328 + 6) = uStack_468;
    local_320 = (undefined1 (*) [64])(*local_320 + 0x20);
    local_328 = local_328 + 8;
  }
  for (; local_33c + 3 < in_ECX; local_33c = local_33c + 4) {
    auVar2._8_8_ = uStack_4a8;
    auVar2._0_8_ = local_4b0;
    auVar2 = vdivps_avx(*(undefined1 (*) [16])*local_320,auVar2);
    local_4a0 = auVar2._0_8_;
    uStack_498 = auVar2._8_8_;
    *(undefined8 *)local_328 = local_4a0;
    *(undefined8 *)(local_328 + 2) = uStack_498;
    local_320 = (undefined1 (*) [64])(*local_320 + 0x10);
    local_328 = local_328 + 4;
  }
  for (; local_33c < in_ECX; local_33c = local_33c + 1) {
    *local_328 = *(float *)*local_320 / fVar1;
    local_320 = (undefined1 (*) [64])(*local_320 + 4);
    local_328 = local_328 + 1;
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_a(const float* ptr, const float* ptr1, float* outptr, int size, int elempack)
{
    const Op op;

    const float a = *ptr;

    int i = 0;
#if __SSE2__
    __m128 _a_128 = (elempack == 4) ? _mm_loadu_ps(ptr) : _mm_set1_ps(a);
#if __AVX__
    __m256 _a_256 = (elempack == 8) ? _mm256_loadu_ps(ptr) : _mm256_insertf128_ps(_mm256_castps128_ps256(_a_128), _a_128, 1);
#if __AVX512F__
    __m512 _a_512 = (elempack == 16) ? _mm512_loadu_ps(ptr) : _mm512_insertf32x8(_mm512_castps256_ps512(_a_256), _a_256, 1);
    for (; i + 15 < size; i += 16)
    {
        __m512 _b = _mm512_loadu_ps(ptr1);
        __m512 _outp = op.func_pack16(_a_512, _b);
        _mm512_storeu_ps(outptr, _outp);
        ptr1 += 16;
        outptr += 16;
    }
#endif // __AVX512F__
    for (; i + 7 < size; i += 8)
    {
        __m256 _b = _mm256_loadu_ps(ptr1);
        __m256 _outp = op.func_pack8(_a_256, _b);
        _mm256_storeu_ps(outptr, _outp);
        ptr1 += 8;
        outptr += 8;
    }
#endif // __AVX__
    for (; i + 3 < size; i += 4)
    {
        __m128 _b = _mm_loadu_ps(ptr1);
        __m128 _outp = op.func_pack4(_a_128, _b);
        _mm_storeu_ps(outptr, _outp);
        ptr1 += 4;
        outptr += 4;
    }
#endif // __SSE2__
    for (; i < size; i++)
    {
        *outptr = op.func(a, *ptr1);
        ptr1 += 1;
        outptr += 1;
    }
}